

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.hpp
# Opt level: O2

void __thiscall
pstore::random_generator<unsigned_short>::random_generator(random_generator<unsigned_short> *this)

{
  uint uVar1;
  
  std::random_device::random_device(&this->device_);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&this->generator_,(ulong)uVar1);
  (this->distribution_)._M_param = (param_type)0xffff0000;
  return;
}

Assistant:

random_generator ()
                : generator_ (device_ ()) {}